

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::Option::Option
          (Option *this,string *opts,string *desc,shared_ptr<const_cxxopts::Value> *value,
          string *arg_help)

{
  std::__cxx11::string::string((string *)this,(string *)opts);
  std::__cxx11::string::string((string *)&this->desc_,(string *)desc);
  std::__shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->value_).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>,
             &value->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&this->arg_help_,(string *)arg_help);
  return;
}

Assistant:

Option
    (
      const std::string& opts,
      const std::string& desc,
      const std::shared_ptr<const Value>& value = ::cxxopts::value<bool>(),
      const std::string& arg_help = ""
    )
    : opts_(opts)
    , desc_(desc)
    , value_(value)
    , arg_help_(arg_help)
    {
    }